

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

int input_bit(uchar *infile)

{
  if (bits_to_go == 0) {
    buffer2 = (int)infile[nextchar];
    nextchar = nextchar + 1;
    bits_to_go = 7;
  }
  else {
    bits_to_go = bits_to_go - 1;
  }
  return (int)(((uint)buffer2 >> (bits_to_go & 0x1fU) & 1) != 0);
}

Assistant:

static int input_bit(unsigned char *infile)
{
	if (bits_to_go == 0) {			/* Read the next byte if no	*/

		buffer2 = infile[nextchar];
		nextchar++;
		
		bits_to_go = 8;
	}
	/*
	 * Return the next bit
	 */
	bits_to_go -= 1;
	return((buffer2>>bits_to_go) & 1);
}